

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_vertex_buffer_unified_memory(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_vertex_buffer_unified_memory != 0) {
    glad_glBufferAddressRangeNV = (PFNGLBUFFERADDRESSRANGENVPROC)(*load)("glBufferAddressRangeNV");
    glad_glVertexFormatNV = (PFNGLVERTEXFORMATNVPROC)(*load)("glVertexFormatNV");
    glad_glNormalFormatNV = (PFNGLNORMALFORMATNVPROC)(*load)("glNormalFormatNV");
    glad_glColorFormatNV = (PFNGLCOLORFORMATNVPROC)(*load)("glColorFormatNV");
    glad_glIndexFormatNV = (PFNGLINDEXFORMATNVPROC)(*load)("glIndexFormatNV");
    glad_glTexCoordFormatNV = (PFNGLTEXCOORDFORMATNVPROC)(*load)("glTexCoordFormatNV");
    glad_glEdgeFlagFormatNV = (PFNGLEDGEFLAGFORMATNVPROC)(*load)("glEdgeFlagFormatNV");
    glad_glSecondaryColorFormatNV =
         (PFNGLSECONDARYCOLORFORMATNVPROC)(*load)("glSecondaryColorFormatNV");
    glad_glFogCoordFormatNV = (PFNGLFOGCOORDFORMATNVPROC)(*load)("glFogCoordFormatNV");
    glad_glVertexAttribFormatNV = (PFNGLVERTEXATTRIBFORMATNVPROC)(*load)("glVertexAttribFormatNV");
    glad_glVertexAttribIFormatNV =
         (PFNGLVERTEXATTRIBIFORMATNVPROC)(*load)("glVertexAttribIFormatNV");
    glad_glGetIntegerui64i_vNV = (PFNGLGETINTEGERUI64I_VNVPROC)(*load)("glGetIntegerui64i_vNV");
  }
  return;
}

Assistant:

static void load_GL_NV_vertex_buffer_unified_memory(GLADloadproc load) {
	if(!GLAD_GL_NV_vertex_buffer_unified_memory) return;
	glad_glBufferAddressRangeNV = (PFNGLBUFFERADDRESSRANGENVPROC)load("glBufferAddressRangeNV");
	glad_glVertexFormatNV = (PFNGLVERTEXFORMATNVPROC)load("glVertexFormatNV");
	glad_glNormalFormatNV = (PFNGLNORMALFORMATNVPROC)load("glNormalFormatNV");
	glad_glColorFormatNV = (PFNGLCOLORFORMATNVPROC)load("glColorFormatNV");
	glad_glIndexFormatNV = (PFNGLINDEXFORMATNVPROC)load("glIndexFormatNV");
	glad_glTexCoordFormatNV = (PFNGLTEXCOORDFORMATNVPROC)load("glTexCoordFormatNV");
	glad_glEdgeFlagFormatNV = (PFNGLEDGEFLAGFORMATNVPROC)load("glEdgeFlagFormatNV");
	glad_glSecondaryColorFormatNV = (PFNGLSECONDARYCOLORFORMATNVPROC)load("glSecondaryColorFormatNV");
	glad_glFogCoordFormatNV = (PFNGLFOGCOORDFORMATNVPROC)load("glFogCoordFormatNV");
	glad_glVertexAttribFormatNV = (PFNGLVERTEXATTRIBFORMATNVPROC)load("glVertexAttribFormatNV");
	glad_glVertexAttribIFormatNV = (PFNGLVERTEXATTRIBIFORMATNVPROC)load("glVertexAttribIFormatNV");
	glad_glGetIntegerui64i_vNV = (PFNGLGETINTEGERUI64I_VNVPROC)load("glGetIntegerui64i_vNV");
}